

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int analyzeAggregate(Walker *pWalker,Expr *pExpr)

{
  byte bVar1;
  u8 enc;
  NameContext *pNVar2;
  Parse *pParse;
  SrcList *pSVar3;
  AggInfo *pAggInfo;
  ExprList *pEVar4;
  int iVar5;
  int iVar6;
  AggInfo_func *pAVar7;
  FuncDef *pFVar8;
  Expr *pEVar9;
  int *piVar10;
  ulong uVar11;
  uint uVar12;
  IndexedExpr *pIVar13;
  long in_FS_OFFSET;
  int i;
  Expr local_88;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pNVar2 = (pWalker->u).pNC;
  pParse = pNVar2->pParse;
  pSVar3 = pNVar2->pSrcList;
  pAggInfo = (pNVar2->uNC).pAggInfo;
  bVar1 = pExpr->op;
  if (bVar1 < 0xaa) {
    if (bVar1 != 0xa8) {
      if (bVar1 == 0xa9) {
        iVar6 = 0;
        if ((((pNVar2->ncFlags & 0x20000) == 0) &&
            (iVar6 = 0, pWalker->walkerDepth == (uint)pExpr->op2)) &&
           (pExpr->pAggInfo == (AggInfo *)0x0)) {
          iVar6 = pAggInfo->nFunc;
          uVar11 = 0;
          if (0 < iVar6) {
            pAVar7 = pAggInfo->aFunc;
            pEVar9 = pAVar7->pFExpr;
            if (pEVar9 != pExpr) {
              uVar12 = 0;
              do {
                pAVar7 = pAVar7 + 1;
                iVar5 = sqlite3ExprCompare((Parse *)0x0,pEVar9,pExpr,-1);
                iVar6 = pAggInfo->nFunc;
                if (iVar5 == 0) {
                  uVar11 = (ulong)uVar12;
                  break;
                }
                uVar11 = (ulong)(uVar12 + 1);
                if (iVar6 <= (int)(uVar12 + 1)) break;
                pEVar9 = pAVar7->pFExpr;
                uVar12 = uVar12 + 1;
              } while (pEVar9 != pExpr);
            }
          }
          if (iVar6 <= (int)uVar11) {
            enc = pParse->db->enc;
            local_88._0_4_ = 0xaaaaaaaa;
            pAVar7 = (AggInfo_func *)
                     sqlite3ArrayAllocate
                               (pParse->db,pAggInfo->aFunc,0x20,&pAggInfo->nFunc,(int *)&local_88);
            pAggInfo->aFunc = pAVar7;
            uVar11 = (ulong)(int)local_88._0_4_;
            if (-1 < (long)uVar11) {
              pAVar7[uVar11].pFExpr = pExpr;
              if ((pExpr->x).pList == (ExprList *)0x0) {
                iVar6 = 0;
              }
              else {
                iVar6 = ((pExpr->x).pList)->nExpr;
              }
              pFVar8 = sqlite3FindFunction(pParse->db,(pExpr->u).zToken,iVar6,enc,'\0');
              pAVar7[uVar11].pFunc = pFVar8;
              pEVar9 = pExpr->pLeft;
              if ((pEVar9 == (Expr *)0x0) || ((pFVar8->funcFlags & 0x20) != 0)) {
                pAVar7[uVar11].iOBTab = -1;
              }
              else {
                iVar5 = pParse->nTab;
                pParse->nTab = iVar5 + 1;
                pAVar7[uVar11].iOBTab = iVar5;
                if (((iVar6 == 1) && (pEVar4 = (pEVar9->x).pList, pEVar4->nExpr == 1)) &&
                   (iVar6 = sqlite3ExprCompare((Parse *)0x0,pEVar4->a[0].pExpr,
                                               ((pExpr->x).pList)->a[0].pExpr,0), iVar6 == 0)) {
                  pAVar7[uVar11].bOBPayload = '\0';
                  pAVar7[uVar11].bOBUnique = (byte)pExpr->flags >> 2 & 1;
                }
                else {
                  pAVar7[uVar11].bOBPayload = '\x01';
                }
                pAVar7[uVar11].bUseSubtype = (byte)((pAVar7[uVar11].pFunc)->funcFlags >> 0x14) & 1;
              }
              iVar6 = -1;
              if (((pExpr->flags & 4) != 0) && (pAVar7[uVar11].bOBUnique == '\0')) {
                iVar6 = pParse->nTab;
                pParse->nTab = iVar6 + 1;
              }
              pAVar7[uVar11].iDistinct = iVar6;
            }
          }
          pExpr->iAgg = (i16)uVar11;
          pExpr->pAggInfo = pAggInfo;
LAB_001a2f64:
          iVar6 = 1;
        }
        goto LAB_001a2d73;
      }
LAB_001a2d5b:
      if ((pNVar2->ncFlags & 0x20000) != 0) {
        for (pIVar13 = pParse->pIdxEpr; pIVar13 != (IndexedExpr *)0x0; pIVar13 = pIVar13->pIENext) {
          if ((-1 < pIVar13->iDataCur) &&
             (iVar6 = sqlite3ExprCompare((Parse *)0x0,pExpr,pIVar13->pExpr,pIVar13->iDataCur),
             iVar6 == 0)) {
            if (((pExpr->flags & 0x3000000) == 0) &&
               (((0 < pSVar3->nSrc && (pSVar3->a[0].iCursor == pIVar13->iDataCur)) &&
                (pExpr->pAggInfo == (AggInfo *)0x0)))) {
              iVar6 = 2;
              if (pParse->nErr != 0) goto LAB_001a2d73;
              local_88.u.zToken = (char *)0x0;
              local_88.pAggInfo = (AggInfo *)0x0;
              local_88.x.pList = (ExprList *)0x0;
              local_88.pLeft = (Expr *)0x0;
              local_88.pRight = (Expr *)0x0;
              local_88.y.pTab = (Table *)0x0;
              local_88.op = 0xaa;
              local_88.affExpr = '\0';
              local_88.op2 = '\0';
              local_88._3_1_ = 0;
              local_88.flags = 0;
              local_88._40_8_ = (ulong)(uint)pIVar13->iIdxCur << 0x20;
              local_88._50_6_ = 0;
              local_88.iColumn = (ushort)pIVar13->iIdxCol;
              findOrCreateAggInfoColumn(pParse,pAggInfo,&local_88);
              if (pParse->nErr != 0) goto LAB_001a2d73;
              pAggInfo->aCol[local_88.iAgg].pCExpr = pExpr;
              pExpr->pAggInfo = pAggInfo;
              pExpr->iAgg = local_88.iAgg;
              goto LAB_001a2f64;
            }
            break;
          }
        }
      }
      iVar6 = 0;
      goto LAB_001a2d73;
    }
  }
  else if ((bVar1 != 0xaa) && (bVar1 != 0xb3)) goto LAB_001a2d5b;
  iVar6 = 0;
  if ((pSVar3 != (SrcList *)0x0) && (iVar5 = pSVar3->nSrc, 0 < iVar5)) {
    piVar10 = &pSVar3->a[0].iCursor;
    do {
      if (pExpr->iTable == *piVar10) {
        findOrCreateAggInfoColumn(pParse,pAggInfo,pExpr);
        break;
      }
      piVar10 = piVar10 + 0x12;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
LAB_001a2d73:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar6;
}

Assistant:

static int analyzeAggregate(Walker *pWalker, Expr *pExpr){
  int i;
  NameContext *pNC = pWalker->u.pNC;
  Parse *pParse = pNC->pParse;
  SrcList *pSrcList = pNC->pSrcList;
  AggInfo *pAggInfo = pNC->uNC.pAggInfo;

  assert( pNC->ncFlags & NC_UAggInfo );
  assert( pAggInfo->iFirstReg==0 );
  switch( pExpr->op ){
    default: {
      IndexedExpr *pIEpr;
      Expr tmp;
      assert( pParse->iSelfTab==0 );
      if( (pNC->ncFlags & NC_InAggFunc)==0 ) break;
      if( pParse->pIdxEpr==0 ) break;
      for(pIEpr=pParse->pIdxEpr; pIEpr; pIEpr=pIEpr->pIENext){
        int iDataCur = pIEpr->iDataCur;
        if( iDataCur<0 ) continue;
        if( sqlite3ExprCompare(0, pExpr, pIEpr->pExpr, iDataCur)==0 ) break;
      }
      if( pIEpr==0 ) break;
      if( NEVER(!ExprUseYTab(pExpr)) ) break;
      for(i=0; i<pSrcList->nSrc; i++){
         if( pSrcList->a[0].iCursor==pIEpr->iDataCur ) break;
      }
      if( i>=pSrcList->nSrc ) break;
      if( NEVER(pExpr->pAggInfo!=0) ) break; /* Resolved by outer context */
      if( pParse->nErr ){ return WRC_Abort; }

      /* If we reach this point, it means that expression pExpr can be
      ** translated into a reference to an index column as described by
      ** pIEpr.
      */
      memset(&tmp, 0, sizeof(tmp));
      tmp.op = TK_AGG_COLUMN;
      tmp.iTable = pIEpr->iIdxCur;
      tmp.iColumn = pIEpr->iIdxCol;
      findOrCreateAggInfoColumn(pParse, pAggInfo, &tmp);
      if( pParse->nErr ){ return WRC_Abort; }
      assert( pAggInfo->aCol!=0 );
      assert( tmp.iAgg<pAggInfo->nColumn );
      pAggInfo->aCol[tmp.iAgg].pCExpr = pExpr;
      pExpr->pAggInfo = pAggInfo;
      pExpr->iAgg = tmp.iAgg;
      return WRC_Prune;
    }
    case TK_IF_NULL_ROW:
    case TK_AGG_COLUMN:
    case TK_COLUMN: {
      testcase( pExpr->op==TK_AGG_COLUMN );
      testcase( pExpr->op==TK_COLUMN );
      testcase( pExpr->op==TK_IF_NULL_ROW );
      /* Check to see if the column is in one of the tables in the FROM
      ** clause of the aggregate query */
      if( ALWAYS(pSrcList!=0) ){
        SrcItem *pItem = pSrcList->a;
        for(i=0; i<pSrcList->nSrc; i++, pItem++){
          assert( !ExprHasProperty(pExpr, EP_TokenOnly|EP_Reduced) );
          if( pExpr->iTable==pItem->iCursor ){
            findOrCreateAggInfoColumn(pParse, pAggInfo, pExpr);
            break;
          } /* endif pExpr->iTable==pItem->iCursor */
        } /* end loop over pSrcList */
      }
      return WRC_Continue;
    }
    case TK_AGG_FUNCTION: {
      if( (pNC->ncFlags & NC_InAggFunc)==0
       && pWalker->walkerDepth==pExpr->op2
       && pExpr->pAggInfo==0
      ){
        /* Check to see if pExpr is a duplicate of another aggregate
        ** function that is already in the pAggInfo structure
        */
        struct AggInfo_func *pItem = pAggInfo->aFunc;
        for(i=0; i<pAggInfo->nFunc; i++, pItem++){
          if( NEVER(pItem->pFExpr==pExpr) ) break;
          if( sqlite3ExprCompare(0, pItem->pFExpr, pExpr, -1)==0 ){
            break;
          }
        }
        if( i>=pAggInfo->nFunc ){
          /* pExpr is original.  Make a new entry in pAggInfo->aFunc[]
          */
          u8 enc = ENC(pParse->db);
          i = addAggInfoFunc(pParse->db, pAggInfo);
          if( i>=0 ){
            int nArg;
            assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
            pItem = &pAggInfo->aFunc[i];
            pItem->pFExpr = pExpr;
            assert( ExprUseUToken(pExpr) );
            nArg = pExpr->x.pList ? pExpr->x.pList->nExpr : 0;
            pItem->pFunc = sqlite3FindFunction(pParse->db,
                                         pExpr->u.zToken, nArg, enc, 0);
            assert( pItem->bOBUnique==0 );
            if( pExpr->pLeft
             && (pItem->pFunc->funcFlags & SQLITE_FUNC_NEEDCOLL)==0
            ){
              /* The NEEDCOLL test above causes any ORDER BY clause on
              ** aggregate min() or max() to be ignored. */
              ExprList *pOBList;
              assert( nArg>0 );
              assert( pExpr->pLeft->op==TK_ORDER );
              assert( ExprUseXList(pExpr->pLeft) );
              pItem->iOBTab = pParse->nTab++;
              pOBList = pExpr->pLeft->x.pList;
              assert( pOBList->nExpr>0 );
              assert( pItem->bOBUnique==0 );
              if( pOBList->nExpr==1
               && nArg==1
               && sqlite3ExprCompare(0,pOBList->a[0].pExpr,
                               pExpr->x.pList->a[0].pExpr,0)==0
              ){
                pItem->bOBPayload = 0;
                pItem->bOBUnique = ExprHasProperty(pExpr, EP_Distinct);
              }else{
                pItem->bOBPayload = 1;
              }
              pItem->bUseSubtype =
                    (pItem->pFunc->funcFlags & SQLITE_SUBTYPE)!=0;
            }else{
              pItem->iOBTab = -1;
            }
            if( ExprHasProperty(pExpr, EP_Distinct) && !pItem->bOBUnique ){
              pItem->iDistinct = pParse->nTab++;
            }else{
              pItem->iDistinct = -1;
            }
          }
        }
        /* Make pExpr point to the appropriate pAggInfo->aFunc[] entry
        */
        assert( !ExprHasProperty(pExpr, EP_TokenOnly|EP_Reduced) );
        ExprSetVVAProperty(pExpr, EP_NoReduce);
        pExpr->iAgg = (i16)i;
        pExpr->pAggInfo = pAggInfo;
        return WRC_Prune;
      }else{
        return WRC_Continue;
      }
    }
  }
  return WRC_Continue;
}